

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi__uint16 *
stbi__load_and_postprocess_16bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  stbi__uint16 *__ptr;
  stbi__uint16 *image;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  long *in_FS_OFFSET;
  ushort uVar9;
  uint uVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  stbi__result_info ri;
  stbi__result_info local_3c;
  
  __ptr = (stbi__uint16 *)stbi__load_main(s,x,y,comp,req_comp,&local_3c,0x10);
  if (__ptr == (stbi__uint16 *)0x0) {
    image = (stbi__uint16 *)0x0;
  }
  else {
    if (local_3c.bits_per_channel == 8) {
      iVar8 = req_comp;
      if (req_comp == 0) {
        iVar8 = *comp;
      }
      iVar8 = *y * *x * iVar8;
      image = (stbi__uint16 *)malloc((long)(iVar8 * 2));
      if (image == (stbi__uint16 *)0x0) {
        in_FS_OFFSET[-0x16] = (long)"outofmem";
        image = (stbi__uint16 *)0x0;
      }
      else {
        if (0 < iVar8) {
          auVar11 = vpbroadcastq_avx512f();
          uVar6 = 0;
          auVar12 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
          auVar13 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
          auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar16 = vmovdqa64_avx512f(_DAT_00a37d40);
          do {
            auVar17 = vpbroadcastq_avx512f();
            auVar18 = vporq_avx512f(auVar17,auVar12);
            auVar19 = vporq_avx512f(auVar17,auVar13);
            auVar20 = vporq_avx512f(auVar17,auVar14);
            auVar17 = vporq_avx512f(auVar17,auVar15);
            uVar1 = vpcmpuq_avx512f(auVar17,auVar11,2);
            uVar2 = vpcmpuq_avx512f(auVar20,auVar11,2);
            uVar3 = vpcmpuq_avx512f(auVar19,auVar11,2);
            uVar4 = vpcmpuq_avx512f(auVar18,auVar11,2);
            bVar5 = (byte)uVar4;
            uVar9 = CONCAT11(bVar5,(byte)uVar3);
            uVar10 = CONCAT22(uVar9,CONCAT11((byte)uVar2,(byte)uVar1));
            auVar17._0_32_ = vmovdqu8_avx512vl(*(undefined1 (*) [32])((long)__ptr + uVar6));
            auVar18[1] = ((byte)(uVar10 >> 1) & 1) * auVar17[1];
            auVar18[0] = ((byte)uVar1 & 1) * auVar17[0];
            auVar18[2] = ((byte)(uVar10 >> 2) & 1) * auVar17[2];
            auVar18[3] = ((byte)(uVar10 >> 3) & 1) * auVar17[3];
            auVar18[4] = ((byte)(uVar10 >> 4) & 1) * auVar17[4];
            auVar18[5] = ((byte)(uVar10 >> 5) & 1) * auVar17[5];
            auVar18[6] = ((byte)(uVar10 >> 6) & 1) * auVar17[6];
            auVar18[7] = ((byte)(uVar10 >> 7) & 1) * auVar17[7];
            auVar18[8] = ((byte)uVar2 & 1) * auVar17[8];
            auVar18[9] = ((byte)(uVar10 >> 9) & 1) * auVar17[9];
            auVar18[10] = ((byte)(uVar10 >> 10) & 1) * auVar17[10];
            auVar18[0xb] = ((byte)(uVar10 >> 0xb) & 1) * auVar17[0xb];
            auVar18[0xc] = ((byte)(uVar10 >> 0xc) & 1) * auVar17[0xc];
            auVar18[0xd] = ((byte)(uVar10 >> 0xd) & 1) * auVar17[0xd];
            auVar18[0xe] = ((byte)(uVar10 >> 0xe) & 1) * auVar17[0xe];
            auVar18[0xf] = ((byte)(uVar10 >> 0xf) & 1) * auVar17[0xf];
            auVar18[0x10] = ((byte)uVar3 & 1) * auVar17[0x10];
            auVar18[0x11] = ((byte)(uVar9 >> 1) & 1) * auVar17[0x11];
            auVar18[0x12] = ((byte)(uVar9 >> 2) & 1) * auVar17[0x12];
            auVar18[0x13] = ((byte)(uVar9 >> 3) & 1) * auVar17[0x13];
            auVar18[0x14] = ((byte)(uVar9 >> 4) & 1) * auVar17[0x14];
            auVar18[0x15] = ((byte)(uVar9 >> 5) & 1) * auVar17[0x15];
            auVar18[0x16] = ((byte)(uVar9 >> 6) & 1) * auVar17[0x16];
            auVar18[0x17] = ((byte)(uVar9 >> 7) & 1) * auVar17[0x17];
            auVar18[0x18] = (bVar5 & 1) * auVar17[0x18];
            auVar18[0x19] = (bVar5 >> 1 & 1) * auVar17[0x19];
            auVar18[0x1a] = (bVar5 >> 2 & 1) * auVar17[0x1a];
            auVar18[0x1b] = (bVar5 >> 3 & 1) * auVar17[0x1b];
            auVar18[0x1c] = (bVar5 >> 4 & 1) * auVar17[0x1c];
            auVar18._30_34_ = auVar17._30_34_;
            auVar18[0x1d] = (bVar5 >> 5 & 1) * auVar17[0x1d];
            auVar17 = vpermb_avx512_vbmi(auVar16,ZEXT3264(auVar18._0_32_));
            auVar17 = vmovdqu16_avx512bw(auVar17);
            *(undefined1 (*) [64])(image + uVar6) = auVar17;
            uVar6 = uVar6 + 0x20;
          } while ((iVar8 + 0x1fU & 0xffffffe0) != uVar6);
        }
        free(__ptr);
      }
      local_3c.bits_per_channel = 0x10;
    }
    else {
      image = __ptr;
      if (local_3c.bits_per_channel != 0x10) {
        pbrt::LogFatal<char_const(&)[54]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
                   ,0x4d3,"Check failed: %s",
                   (char (*) [54])"ri.bits_per_channel == 8 || ri.bits_per_channel == 16");
      }
    }
    piVar7 = &stbi__vertically_flip_on_load_global;
    if (*(int *)((long)in_FS_OFFSET + -0xa4) != 0) {
      piVar7 = (int *)(*in_FS_OFFSET + -0xa8);
    }
    if (*piVar7 != 0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(image,*x,*y,req_comp * 2);
    }
  }
  return image;
}

Assistant:

static stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 16);

   if (result == NULL)
      return NULL;

   // it is the responsibility of the loaders to make sure we get either 8 or 16 bit.
   STBI_ASSERT(ri.bits_per_channel == 8 || ri.bits_per_channel == 16);

   if (ri.bits_per_channel != 16) {
      result = stbi__convert_8_to_16((stbi_uc *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 16;
   }

   // @TODO: move stbi__convert_format16 to here
   // @TODO: special case RGB-to-Y (and RGBA-to-YA) for 8-bit-to-16-bit case to keep more precision

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi__uint16));
   }

   return (stbi__uint16 *) result;
}